

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BinaryOperator>::run
          (TypedDeleter<LLVMBC::BinaryOperator> *this)

{
  TypedDeleter<LLVMBC::BinaryOperator> *this_local;
  
  BinaryOperator::~BinaryOperator(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}